

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O2

void h262_print_slice(h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  uint addr;
  ulong uVar1;
  long lVar2;
  
  puts("Slice:");
  printf("\tslice_vertical_position = %d\n",(ulong)slice->slice_vertical_position);
  printf("\tquantiser_scale_code = %d\n",(ulong)slice->quantiser_scale_code);
  uVar1 = (ulong)(int)slice->first_mb_in_slice;
  if (uVar1 != 0xffffffffffffffff) {
    lVar2 = uVar1 * 0xc84;
    while (addr = (uint)uVar1, addr <= slice->last_mb_in_slice) {
      h262_print_macroblock
                (seqparm,picparm,
                 (h262_macroblock *)
                 ((long)&((h262_macroblock *)(slice->mbs->motion_vertical_field_select + -5))->
                         macroblock_skipped + lVar2),addr);
      lVar2 = lVar2 + 0xc84;
      uVar1 = (ulong)(addr + 1);
    }
  }
  return;
}

Assistant:

void h262_print_slice(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	int i;
	printf("Slice:\n");
	printf("\tslice_vertical_position = %d\n", slice->slice_vertical_position);
	printf("\tquantiser_scale_code = %d\n", slice->quantiser_scale_code);
	/* XXX**/
	if (slice->first_mb_in_slice == -1)
		return;
	for (i = slice->first_mb_in_slice; i <= slice->last_mb_in_slice; i++) {
		h262_print_macroblock(seqparm, picparm, &slice->mbs[i], i);
	}
}